

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  pointer pcVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  bool bVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  string desc;
  string __str;
  size_type *local_110;
  size_type local_100;
  undefined8 uStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (app->description_)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (app->description_)._M_string_length);
  uVar12 = app->require_option_min_;
  uVar9 = app->require_option_max_;
  if (app->required_ == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_b0," REQUIRED ");
  }
  if (uVar12 == 0 || uVar9 != uVar12) {
    if (uVar9 == 0) {
      if (uVar12 == 0) goto LAB_0011252f;
      uVar14 = 1;
      if (9 < uVar12) {
        uVar9 = uVar12;
        uVar6 = 4;
        do {
          uVar14 = uVar6;
          if (uVar9 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_001125af;
          }
          if (uVar9 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_001125af;
          }
          if (uVar9 < 10000) goto LAB_001125af;
          bVar5 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar6 = uVar14 + 4;
        } while (bVar5);
        uVar14 = uVar14 + 1;
      }
LAB_001125af:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_d0,(ulong)uVar14,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar12);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d0,0,0," \n[At least ",0xc);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar7->_M_dataplus)._M_p;
      paVar10 = &pbVar7->field_2;
      if (paVar11 == paVar10) {
        local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_f0._M_dataplus._M_p = (pointer)paVar11;
      }
      local_f0._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f0," of the following options are required]");
      local_110 = &local_100;
      psVar4 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar11 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4 == paVar11) {
        local_100 = paVar11->_M_allocated_capacity;
        uStack_f8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_100 = paVar11->_M_allocated_capacity;
        local_110 = psVar4;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b0,(char *)local_110,sVar2);
LAB_001127a0:
      if (local_110 != &local_100) goto LAB_0011219e;
      goto LAB_001121ab;
    }
    uVar14 = 1;
    if (uVar12 == 0) {
      if (9 < uVar9) {
        uVar12 = uVar9;
        uVar6 = 4;
        do {
          uVar14 = uVar6;
          if (uVar12 < 100) {
            uVar14 = uVar14 - 2;
            goto LAB_001126ab;
          }
          if (uVar12 < 1000) {
            uVar14 = uVar14 - 1;
            goto LAB_001126ab;
          }
          if (uVar12 < 10000) goto LAB_001126ab;
          bVar5 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          uVar6 = uVar14 + 4;
        } while (bVar5);
        uVar14 = uVar14 + 1;
      }
LAB_001126ab:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_d0,(ulong)uVar14,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar9);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d0,0,0," \n[At most ",0xb);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar7->_M_dataplus)._M_p;
      paVar10 = &pbVar7->field_2;
      if (paVar11 == paVar10) {
        local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_f0._M_dataplus._M_p = (pointer)paVar11;
      }
      local_f0._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_f0," of the following options are allowed]");
      local_110 = &local_100;
      psVar4 = (size_type *)(pbVar7->_M_dataplus)._M_p;
      paVar11 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4 == paVar11) {
        local_100 = paVar11->_M_allocated_capacity;
        uStack_f8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_100 = paVar11->_M_allocated_capacity;
        local_110 = psVar4;
      }
      sVar2 = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b0,(char *)local_110,sVar2);
      goto LAB_001127a0;
    }
    if (9 < uVar12) {
      uVar8 = uVar12;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar8 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001121e1;
        }
        if (uVar8 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001121e1;
        }
        if (uVar8 < 10000) goto LAB_001121e1;
        bVar5 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_001121e1:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar12);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0," \n[Between ",0xb);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if (paVar11 == paVar10) {
      local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_70._M_dataplus._M_p = (pointer)paVar11;
    }
    local_70._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70," and ");
    paVar11 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar10) {
      local_d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_d0._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_d0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    uVar14 = 1;
    if (9 < uVar9) {
      uVar12 = uVar9;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar12 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00112333;
        }
        if (uVar12 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00112333;
        }
        if (uVar12 < 10000) goto LAB_00112333;
        bVar5 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_00112333:
    paVar10 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_90,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar9);
    uVar12 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
             local_d0._M_string_length;
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar11) {
      uVar15 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar12) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar10) {
        uVar15 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < uVar12) goto LAB_001123b0;
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    }
    else {
LAB_001123b0:
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_d0,local_90._M_dataplus._M_p,
                         CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar7->_M_dataplus)._M_p;
    paVar13 = &pbVar7->field_2;
    if (paVar3 == paVar13) {
      local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)paVar3;
    }
    local_f0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar7->_M_string_length = 0;
    paVar13->_M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_f0," of the follow options are required]");
    local_110 = (size_type *)(pbVar7->_M_dataplus)._M_p;
    paVar13 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110 == paVar13) {
      local_100 = paVar13->_M_allocated_capacity;
      uStack_f8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_110 = &local_100;
    }
    else {
      local_100 = paVar13->_M_allocated_capacity;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_b0,(char *)local_110,sVar2);
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar10) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar11) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Var16._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0011252f;
  }
  else {
    if (uVar12 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_b0," \n[Exactly 1 of the following options is required]");
      goto LAB_0011252f;
    }
    uVar14 = 1;
    if (9 < uVar12) {
      uVar9 = uVar12;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        if (uVar9 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0011209f;
        }
        if (uVar9 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0011209f;
        }
        if (uVar9 < 10000) goto LAB_0011209f;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar6 = uVar14 + 4;
      } while (bVar5);
      uVar14 = uVar14 + 1;
    }
LAB_0011209f:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_d0,(ulong)uVar14,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar12);
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_d0,0,0," \n[Exactly ",0xb);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar7->_M_dataplus)._M_p;
    paVar10 = &pbVar7->field_2;
    if (paVar11 == paVar10) {
      local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)paVar11;
    }
    local_f0._M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_f0,"options from the following list are required]");
    local_110 = (size_type *)(pbVar7->_M_dataplus)._M_p;
    paVar11 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110 == paVar11) {
      local_100 = paVar11->_M_allocated_capacity;
      uStack_f8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      local_110 = &local_100;
    }
    else {
      local_100 = paVar11->_M_allocated_capacity;
    }
    sVar2 = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_b0,(char *)local_110,sVar2);
    if (local_110 != &local_100) {
LAB_0011219e:
      operator_delete(local_110,local_100 + 1);
    }
LAB_001121ab:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    _Var16._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0011252f;
  }
  operator_delete(_Var16._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0011252f:
  if (local_b0._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}